

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__start_file(stbi__context *s,FILE *f)

{
  FILE *f_local;
  stbi__context *s_local;
  
  stbi__start_callbacks(s,&stbi__stdio_callbacks,f);
  return;
}

Assistant:

static void stbi__start_file(stbi__context *s, FILE *f)
{
   stbi__start_callbacks(s, &stbi__stdio_callbacks, (void *) f);
}